

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

int64 google::protobuf::internal::anon_unknown_0::SecondsSinceCommonEra(DateTime *time)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int64 iVar4;
  int local_30;
  int month;
  int count_400years;
  int year;
  int64 result;
  DateTime *time_local;
  
  _count_400years = 0;
  bVar2 = false;
  if (0 < time->year) {
    bVar2 = time->year < 10000;
  }
  if (!bVar2) {
    __assert_fail("time.year >= 1 && time.year <= 9999","third_party/protobuf-lite/time.cc",0x5e,
                  "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                 );
  }
  month = 1;
  if (399 < time->year + -1) {
    iVar3 = (time->year + -1) / 400;
    _count_400years = (long)iVar3 * 0x2f0605980;
    month = iVar3 * 400 + 1;
  }
  for (; 99 < time->year - month; month = month + 100) {
    iVar4 = SecondsPer100Years(month);
    _count_400years = iVar4 + _count_400years;
  }
  for (; 3 < time->year - month; month = month + 4) {
    iVar4 = SecondsPer4Years(month);
    _count_400years = iVar4 + _count_400years;
  }
  for (; month < time->year; month = month + 1) {
    iVar4 = SecondsPerYear(month);
    _count_400years = iVar4 + _count_400years;
  }
  bVar2 = false;
  if (0 < time->month) {
    bVar2 = time->month < 0xd;
  }
  if (bVar2) {
    iVar3 = time->month;
    _count_400years =
         (long)*(int *)((anonymous_namespace)::kDaysSinceJan + (long)iVar3 * 4) * 0x15180 +
         _count_400years;
    if ((2 < iVar3) && (bVar2 = IsLeapYear(month), bVar2)) {
      _count_400years = _count_400years + 0x15180;
    }
    bVar2 = false;
    if (0 < time->day) {
      iVar1 = time->day;
      if ((iVar3 == 2) && (bVar2 = IsLeapYear(month), bVar2)) {
        local_30 = 0x1d;
      }
      else {
        local_30 = *(int *)((anonymous_namespace)::kDaysInMonth + (long)iVar3 * 4);
      }
      bVar2 = iVar1 <= local_30;
    }
    if (bVar2) {
      return (long)time->hour * 0xe10 + (long)time->minute * 0x3c + (long)time->second +
             (long)(time->day + -1) * 0x15180 + _count_400years;
    }
    __assert_fail("time.day >= 1 && time.day <= (month == 2 && IsLeapYear(year) ? kDaysInMonth[month] + 1 : kDaysInMonth[month])"
                  ,"third_party/protobuf-lite/time.cc",0x7b,
                  "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                 );
  }
  __assert_fail("time.month >= 1 && time.month <= 12","third_party/protobuf-lite/time.cc",0x72,
                "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
               );
}

Assistant:

int64 SecondsSinceCommonEra(const DateTime& time) {
  int64 result = 0;
  // Years should be between 1 and 9999.
  assert(time.year >= 1 && time.year <= 9999);
  int year = 1;
  if ((time.year - year) >= 400) {
    int count_400years = (time.year - year) / 400;
    result += kSecondsPer400Years * count_400years;
    year += count_400years * 400;
  }
  while ((time.year - year) >= 100) {
    result += SecondsPer100Years(year);
    year += 100;
  }
  while ((time.year - year) >= 4) {
    result += SecondsPer4Years(year);
    year += 4;
  }
  while (time.year > year) {
    result += SecondsPerYear(year);
    ++year;
  }
  // Months should be between 1 and 12.
  assert(time.month >= 1 && time.month <= 12);
  int month = time.month;
  result += kSecondsPerDay * kDaysSinceJan[month];
  if (month > 2 && IsLeapYear(year)) {
    result += kSecondsPerDay;
  }
  assert(time.day >= 1 &&
         time.day <= (month == 2 && IsLeapYear(year)
                          ? kDaysInMonth[month] + 1
                          : kDaysInMonth[month]));
  result += kSecondsPerDay * (time.day - 1);
  result += kSecondsPerHour * time.hour +
      kSecondsPerMinute * time.minute +
      time.second;
  return result;
}